

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionProxy::UpdateFunctionBodyImpl(FunctionProxy *this,FunctionBody *body)

{
  Type *addr;
  Type TVar1;
  FunctionInfo *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  pFVar2 = (this->functionInfo).ptr;
  if ((pFVar2->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80b,"(functionInfo->GetFunctionProxy() == this)",
                                "functionInfo->GetFunctionProxy() == this");
    if (!bVar4) goto LAB_00766a99;
    *puVar5 = 0;
  }
  bVar4 = IsFunctionBody(this);
  if (body != (FunctionBody *)this && bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80c,"(!this->IsFunctionBody() || body == this)",
                                "!this->IsFunctionBody() || body == this");
    if (!bVar4) goto LAB_00766a99;
    *puVar5 = 0;
  }
  Memory::Recycler::WBSetBit((char *)&pFVar2->functionBodyImpl);
  (pFVar2->functionBodyImpl).ptr = (FunctionProxy *)body;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pFVar2->functionBodyImpl);
  addr = &(body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo;
  Memory::Recycler::WBSetBit((char *)addr);
  (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr = pFVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  TVar1 = pFVar2->attributes;
  if ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x54c,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_00766a99;
    *puVar5 = 0;
  }
  if ((FunctionBody *)
      (((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != body) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) {
LAB_00766a99:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  addr->ptr->attributes = TVar1 & ~(DeferredParse|DeferredDeserialize);
  return;
}

Assistant:

void
    FunctionProxy::UpdateFunctionBodyImpl(FunctionBody * body)
    {
        FunctionInfo *functionInfo = this->GetFunctionInfo();
        Assert(functionInfo->GetFunctionProxy() == this);
        Assert(!this->IsFunctionBody() || body == this);
        functionInfo->SetFunctionProxy(body);
        body->SetFunctionInfo(functionInfo);
        body->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() & ~(FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::DeferredDeserialize)));
    }